

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rco.cpp
# Opt level: O2

void __thiscall RCO::dump(RCO *this,string *outputDirectory)

{
  FILE *__s;
  string sStack_f8;
  string outputFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,outputDirectory,"/");
  createDirectory(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator+(&local_58,outputDirectory,"/xmls/");
  createDirectory(&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::operator+(&local_78,outputDirectory,"/textures/");
  createDirectory(&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::operator+(&local_98,outputDirectory,"/sounds/");
  createDirectory(&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::operator+(&local_b8,outputDirectory,"/layouts/");
  createDirectory(&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::operator+(&outputFile,outputDirectory,"/index.xml");
  __s = fopen(outputFile._M_dataplus._M_p,"wb");
  fwrite("<?xml version=\"1.0\" encoding=\"utf-8\"?>\r\n",0x28,1,__s);
  std::__cxx11::string::string((string *)&sStack_f8,(string *)outputDirectory);
  dumpElement(this,(FILE *)__s,&this->mRootElement,0,&sStack_f8);
  std::__cxx11::string::~string((string *)&sStack_f8);
  fclose(__s);
  std::__cxx11::string::~string((string *)&outputFile);
  return;
}

Assistant:

void RCO::dump(std::string outputDirectory)
{
	createDirectory(outputDirectory + "/");
	createDirectory(outputDirectory + "/xmls/");
	createDirectory(outputDirectory + "/textures/");
	createDirectory(outputDirectory + "/sounds/");
	createDirectory(outputDirectory + "/layouts/");

	std::string outputFile = outputDirectory + "/index.xml";

	FILE *f = fopen(outputFile.c_str(), "wb");

	fprintf(f, "<?xml version=\"1.0\" encoding=\"utf-8\"?>\r\n");
	dumpElement(f, mRootElement, 0, outputDirectory);

	fclose(f);
}